

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O3

ostream * __thiscall Polynomial::debug_display(Polynomial *this,ostream *o)

{
  pointer poVar1;
  int *piVar2;
  char cVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  int *piVar9;
  ulong uVar10;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"Polynomial: numstates=",0x16);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)o,this->mNumStates);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," numvars=",9);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->mNumVariables);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," evalValuesLength=",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," resultLoc=",0xb);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->mResultLocation);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," firstOp=",9);
  plVar5 = (long *)std::ostream::operator<<((ostream *)poVar4,this->mFirstOperation);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(o," program: ",10);
  cVar3 = (char)o;
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (0 < this->mNumStates) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"    ",4);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)o,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," (constant)",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar7 = iVar7 + 1;
    } while (iVar7 < this->mNumStates);
  }
  if (0 < this->mNumVariables) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"    ",4);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)o,this->mNumStates + iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = x",4);
      plVar5 = (long *)std::ostream::operator<<((ostream *)poVar4,iVar7);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      iVar7 = iVar7 + 1;
    } while (iVar7 < this->mNumVariables);
  }
  if ((this->mOperands).
      super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mOperands).
      super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"    ",4);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)o,this->mFirstOperation + (int)uVar10)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      switch((this->mOperands).
             super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
             super__Vector_impl_data._M_start[uVar10].op) {
      case PLUS:
        lVar6 = 4;
        pcVar8 = "PLUS";
        break;
      case TIMES:
        lVar6 = 5;
        pcVar8 = "TIMES";
        break;
      case POWER:
        lVar6 = 5;
        pcVar8 = "POWER";
        break;
      case NOT:
        lVar6 = 3;
        pcVar8 = "NOT";
        break;
      case MAX:
        lVar6 = 3;
        pcVar8 = "MAX";
        break;
      case MIN:
        lVar6 = 3;
        pcVar8 = "MIN";
        break;
      default:
        goto switchD_00106dd3_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,pcVar8,lVar6);
switchD_00106dd3_default:
      poVar1 = (this->mOperands).
               super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl
               .super__Vector_impl_data._M_start;
      piVar2 = *(pointer *)
                ((long)&poVar1[uVar10].args.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                8);
      for (piVar9 = *(int **)&poVar1[uVar10].args.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl; piVar9 != piVar2; piVar9 = piVar9 + 1) {
        iVar7 = *piVar9;
        std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
        std::ostream::operator<<((ostream *)o,iVar7);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(this->mOperands).
                                    super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->mOperands).
                                    super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return o;
}

Assistant:

std::ostream& Polynomial::debug_display(std::ostream& o) const
{
  o << "Polynomial: numstates=" << mNumStates
    << " numvars=" << mNumVariables
    << " evalValuesLength=" << mEvaluationValues.size()
    << " resultLoc=" << mResultLocation
    << " firstOp=" << mFirstOperation << std::endl;
  o << " program: " << std::endl;
  for (int i=0; i<mNumStates; i++)
    o << "    " << i << " = " << i << " (constant)" << std::endl;
  for (int i=0; i<mNumVariables; i++)
    o << "    " << i+mNumStates << " = x" << i << std::endl;
  for (int i=0; i < mOperands.size(); i++)
    {
      o << "    " << mFirstOperation+i << " = ";
      switch (mOperands[i].op)
        {
        case operandType::PLUS:
          o << "PLUS";
          break;
        case operandType::TIMES:
          o << "TIMES";
          break;
        case operandType::POWER:
          o << "POWER";
          break;
        case operandType::MAX:
          o << "MAX";
          break;
        case operandType::MIN:
          o << "MIN";
          break;
        case operandType::NOT:
          o << "NOT";
          break;
        }
      for (auto a : mOperands[i].args)
        o << " " << a;
      o << std::endl;
      // o << " " << mOperands[i].first_arg << " " << mOperands[i].second_arg << std::endl;
    }
  return o;
}